

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void __thiscall
basist::dxt5a_block::set_selector(dxt5a_block *this,uint32_t x,uint32_t y,uint32_t val)

{
  byte bVar1;
  byte bVar2;
  uint in_ECX;
  uint uVar3;
  uint uVar4;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  bool bVar5;
  uint32_t v;
  uint32_t bit_ofs;
  uint32_t byte_index;
  uint32_t bit_index;
  uint32_t selector_index;
  uint local_28;
  
  bVar5 = false;
  if ((in_ESI < 4) && (bVar5 = false, in_EDX < 4)) {
    bVar5 = in_ECX < 8;
  }
  if (!bVar5) {
    __assert_fail("(x < 4U) && (y < 4U) && (val < 8U)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0xa44,"void basist::dxt5a_block::set_selector(uint32_t, uint32_t, uint32_t)");
  }
  uVar3 = (in_EDX * 4 + in_ESI) * 3;
  uVar4 = uVar3 >> 3;
  bVar2 = (byte)uVar3 & 7;
  bVar1 = *(byte *)(in_RDI + 2 + (ulong)uVar4);
  local_28 = (uint)bVar1;
  if (uVar4 < 5) {
    local_28 = (uint)CONCAT11(*(undefined1 *)(in_RDI + 2 + (ulong)(uVar4 + 1)),bVar1);
  }
  uVar3 = in_ECX << bVar2 | (7 << bVar2 ^ 0xffffffffU) & local_28;
  *(char *)(in_RDI + 2 + (ulong)uVar4) = (char)uVar3;
  if (uVar4 < 5) {
    *(char *)(in_RDI + 2 + (ulong)(uVar4 + 1)) = (char)(uVar3 >> 8);
  }
  return;
}

Assistant:

inline void set_selector(uint32_t x, uint32_t y, uint32_t val)
		{
			assert((x < 4U) && (y < 4U) && (val < 8U));

			uint32_t selector_index = (y * 4) + x;
			uint32_t bit_index = selector_index * cDXT5SelectorBits;

			uint32_t byte_index = bit_index >> 3;
			uint32_t bit_ofs = bit_index & 7;

			uint32_t v = m_selectors[byte_index];
			if (byte_index < (cTotalSelectorBytes - 1))
				v |= (m_selectors[byte_index + 1] << 8);

			v &= (~(7 << bit_ofs));
			v |= (val << bit_ofs);

			m_selectors[byte_index] = static_cast<uint8_t>(v);
			if (byte_index < (cTotalSelectorBytes - 1))
				m_selectors[byte_index + 1] = static_cast<uint8_t>(v >> 8);
		}